

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndTabItem(void)

{
  short sVar1;
  ImGuiWindow *pIVar2;
  ImGuiTabBar *pIVar3;
  
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    pIVar3 = GImGui->CurrentTabBar;
    if (pIVar3 == (ImGuiTabBar *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc2,"EndTabItem","ImGui ASSERT FAILED: %s",
                  "tab_bar != NULL && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                 );
      return;
    }
    if (pIVar3->LastTabItemIdx < 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc5,"EndTabItem","ImGui ASSERT FAILED: %s","tab_bar->LastTabItemIdx >= 0");
    }
    sVar1 = pIVar3->LastTabItemIdx;
    if ((pIVar3->Tabs).Size <= (int)sVar1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    if (((pIVar3->Tabs).Data[(int)sVar1].Flags & 8) == 0) {
      if ((pIVar2->IDStack).Size < 1) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x61a,"pop_back","ImGui ASSERT FAILED: %s","Size > 0");
      }
      (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + -1;
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar != NULL && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        window->IDStack.pop_back();
}